

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O1

void Ssc_GiaSimProcessRefined(Gia_Man_t *p,Vec_Int_t *vRefined)

{
  ulong *puVar1;
  Gia_Rpr_t GVar2;
  Gia_Rpr_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  void *__ptr;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (vRefined->nSize != 0) {
    uVar9 = vRefined->nSize / 3 + 99;
    while( true ) {
      do {
        uVar11 = uVar9 + 1;
        uVar5 = uVar9 & 1;
        uVar9 = uVar11;
      } while (uVar5 != 0);
      if (uVar11 < 9) break;
      iVar7 = 5;
      while (uVar11 % (iVar7 - 2U) != 0) {
        uVar5 = iVar7 * iVar7;
        iVar7 = iVar7 + 2;
        if (uVar11 < uVar5) goto LAB_005b4b9e;
      }
    }
LAB_005b4b9e:
    __ptr = calloc((long)(int)uVar11,4);
    if (0 < vRefined->nSize) {
      lVar8 = 0;
      do {
        iVar7 = vRefined->pArray[lVar8];
        uVar4 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
        iVar6 = (int)uVar4;
        uVar9 = iVar6 * iVar7;
        if (((int)uVar9 < 0) || (p->vSims->nSize <= (int)uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        puVar1 = p->vSims->pArray + uVar9;
        if ((*puVar1 & 1) == 0) {
          if (iVar6 < 1) {
LAB_005b4e2c:
            __assert_fail("!Ssc_GiaSimIsConst0( p, i )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xe6,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
          uVar13 = 0;
          while (puVar1[uVar13] == 0) {
            uVar13 = uVar13 + 1;
            if ((uVar4 & 0xffffffff) == uVar13) goto LAB_005b4e2c;
          }
        }
        else {
          if (iVar6 < 1) goto LAB_005b4e2c;
          uVar13 = 0;
          while (puVar1[uVar13] == 0xffffffffffffffff) {
            uVar13 = uVar13 + 1;
            if ((uVar4 & 0xffffffff) == uVar13) goto LAB_005b4e2c;
          }
        }
        if ((*puVar1 & 1) == 0) {
          if (iVar6 < 1) {
LAB_005b4cb9:
            uVar9 = 0;
          }
          else {
            uVar13 = 0;
            uVar9 = 0;
            do {
              uVar9 = uVar9 ^ *(int *)(Ssc_GiaSimHashKey_s_Primes + (ulong)((uint)uVar13 & 0xf) * 4)
                              * (int)puVar1[uVar13];
              uVar13 = uVar13 + 1;
            } while ((uVar4 & 0xffffffff) != uVar13);
          }
        }
        else {
          if (iVar6 < 1) goto LAB_005b4cb9;
          uVar13 = 0;
          uVar9 = 0;
          do {
            uVar9 = uVar9 ^ ~(uint)puVar1[uVar13] *
                            *(int *)(Ssc_GiaSimHashKey_s_Primes + (ulong)((uint)uVar13 & 0xf) * 4);
            uVar13 = uVar13 + 1;
          } while ((uVar4 & 0xffffffff) != uVar13);
        }
        uVar5 = *(uint *)((long)__ptr + (long)(int)(uVar9 % uVar11) * 4);
        lVar10 = (long)(int)uVar5;
        if (lVar10 == 0) {
          GVar2 = p->pReprs[iVar7];
          if (((uint)GVar2 & 0xfffffff) != 0) {
            __assert_fail("Gia_ObjRepr(p, i) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xea,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
          if (p->pNexts[iVar7] != 0) {
            __assert_fail("Gia_ObjNext(p, i) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xeb,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
          p->pReprs[iVar7] = (Gia_Rpr_t)((uint)GVar2 | 0xfffffff);
        }
        else {
          p->pNexts[lVar10] = iVar7;
          pGVar3 = p->pReprs;
          uVar12 = (uint)pGVar3[lVar10] & 0xfffffff;
          if (iVar7 <= (int)uVar12 && uVar12 != 0xfffffff) {
LAB_005b4e6a:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          pGVar3[iVar7] = (Gia_Rpr_t)((uint)pGVar3[iVar7] & 0xf0000000 | uVar12);
          GVar2 = p->pReprs[iVar7];
          if ((~(uint)GVar2 & 0xfffffff) == 0) {
            if (iVar7 <= (int)uVar5 && uVar5 != 0xfffffff) goto LAB_005b4e6a;
            p->pReprs[iVar7] = (Gia_Rpr_t)((uint)GVar2 & 0xf0000000 | uVar5 & 0xfffffff);
          }
          if (((uint)p->pReprs[iVar7] & 0xfffffff) == 0) {
            __assert_fail("Gia_ObjRepr(p, i) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                          ,0xf4,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
          }
        }
        *(int *)((long)__ptr + (long)(int)(uVar9 % uVar11) * 4) = iVar7;
        lVar8 = lVar8 + 1;
      } while (lVar8 < vRefined->nSize);
    }
    if (0 < vRefined->nSize) {
      lVar8 = 0;
      do {
        iVar7 = vRefined->pArray[lVar8];
        if (((~(uint)p->pReprs[iVar7] & 0xfffffff) == 0) && (0 < p->pNexts[iVar7])) {
          Ssc_GiaSimClassRefineOne(p,iVar7);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vRefined->nSize);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void Ssc_GiaSimProcessRefined( Gia_Man_t * p, Vec_Int_t * vRefined )
{
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 100 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        assert( !Ssc_GiaSimIsConst0( p, i ) );
        Key = Ssc_GiaSimHashKey( p, i, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p, i) == 0 );
            assert( Gia_ObjNext(p, i) == 0 );
            Gia_ObjSetRepr( p, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p, pTable[Key], i );
            Gia_ObjSetRepr( p, i, Gia_ObjRepr(p, pTable[Key]) );
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                Gia_ObjSetRepr( p, i, pTable[Key] );
            assert( Gia_ObjRepr(p, i) > 0 );
        }
        pTable[Key] = i;
    }
    Vec_IntForEachEntry( vRefined, i, k )
        if ( Gia_ObjIsHead( p, i ) )
            Ssc_GiaSimClassRefineOne( p, i );
    ABC_FREE( pTable );
}